

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O3

FT_Error ft_smooth_render_generic
                   (FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                   FT_Vector *origin,FT_Render_Mode required_mode)

{
  FT_UInt *pFVar1;
  FT_Outline *outline;
  FT_Bitmap *pFVar2;
  uchar **ppuVar3;
  uint uVar4;
  FT_Memory memory;
  uchar *puVar5;
  ulong uVar6;
  size_t __n;
  FT_Pointer __src;
  int iVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long yOffset;
  ulong uVar13;
  undefined1 local_f0 [8];
  FT_Raster_Params params;
  ulong local_60;
  long local_48;
  FT_Error local_34 [2];
  FT_Error error;
  
  local_34[0] = 0;
  outline = &slot->outline;
  memory = (render->root).memory;
  if (slot->format == render->glyph_format) {
    if (mode != required_mode) {
      local_34[0] = 0x13;
      goto LAB_002219bd;
    }
    if ((slot->internal->flags & 1) != 0) {
      ft_mem_free(memory,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 & 0xfffffffe;
    }
    ft_glyphslot_preset_bitmap(slot,mode,origin);
    puVar5 = (uchar *)ft_mem_realloc(memory,(long)(slot->bitmap).pitch,0,(ulong)(slot->bitmap).rows,
                                     (void *)0x0,local_34);
    local_48 = 0;
    (slot->bitmap).buffer = puVar5;
    yOffset = 0;
    if (local_34[0] == 0) {
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      local_48 = (long)(slot->bitmap_left * -0x40);
      iVar7 = (slot->bitmap).rows << 6;
      if ((slot->bitmap).pixel_mode == '\x06') {
        iVar7 = iVar7 / 3;
      }
      yOffset = (long)iVar7 + (long)(slot->bitmap_top * -0x40);
      if (origin != (FT_Vector *)0x0) {
        local_48 = local_48 + origin->x;
        yOffset = yOffset + origin->y;
      }
      pFVar2 = &slot->bitmap;
      if (local_48 != 0 || yOffset != 0) {
        FT_Outline_Translate(outline,local_48,yOffset);
      }
      params.source._0_4_ = 1;
      local_f0 = (undefined1  [8])pFVar2;
      params.target = (FT_Bitmap *)outline;
      if (mode == FT_RENDER_MODE_LCD_V) {
        iVar7 = (slot->bitmap).pitch;
        (slot->bitmap).pitch = iVar7 * 3;
        (slot->bitmap).rows = (slot->bitmap).rows / 3;
        ppuVar3 = &(slot->bitmap).buffer;
        *ppuVar3 = *ppuVar3 + iVar7;
        local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
        if (local_34[0] == 0) {
          FT_Outline_Translate(outline,0,0x15);
          ppuVar3 = &(slot->bitmap).buffer;
          *ppuVar3 = *ppuVar3 + iVar7;
          local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
          if (local_34[0] == 0) {
            FT_Outline_Translate(outline,0,-0x2a);
            yOffset = yOffset + -0x15;
            ppuVar3 = &(slot->bitmap).buffer;
            *ppuVar3 = *ppuVar3 + -(long)(iVar7 * 2);
            local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
            if (local_34[0] == 0) {
              (slot->bitmap).pitch = (slot->bitmap).pitch / 3;
              (slot->bitmap).rows = (slot->bitmap).rows * 3;
              goto LAB_00221aa6;
            }
          }
          else {
            yOffset = yOffset + 0x15;
          }
        }
      }
      else if (mode == FT_RENDER_MODE_LCD) {
        uVar6 = (ulong)(slot->bitmap).rows;
        uVar4 = (slot->bitmap).width;
        __n = (size_t)(slot->bitmap).pitch;
        uVar12 = (ulong)uVar4 / 3;
        ppuVar3 = &(slot->bitmap).buffer;
        *ppuVar3 = *ppuVar3 + uVar12;
        local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
        if (local_34[0] == 0) {
          FT_Outline_Translate(outline,-0x15,0);
          ppuVar3 = &(slot->bitmap).buffer;
          *ppuVar3 = *ppuVar3 + uVar12;
          local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
          if (local_34[0] == 0) {
            FT_Outline_Translate(outline,0x2a,0);
            local_48 = local_48 + 0x15;
            ppuVar3 = &(slot->bitmap).buffer;
            *ppuVar3 = *ppuVar3 + -(ulong)((uVar4 / 3) * 2);
            local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
            if ((local_34[0] == 0) && (__src = ft_mem_alloc(memory,__n,local_34), local_34[0] == 0))
            {
              if (uVar6 != 0) {
                uVar10 = (ulong)((uVar4 / 3) * 2);
                lVar11 = 0;
                uVar13 = 0;
                local_60 = uVar12;
                do {
                  puVar5 = (slot->bitmap).buffer;
                  if (2 < uVar4) {
                    uVar9 = 0;
                    puVar8 = (uchar *)((long)__src + 2);
                    do {
                      puVar8[-2] = puVar5[uVar9 + lVar11];
                      puVar8[-1] = puVar5[uVar9 + local_60];
                      *puVar8 = puVar5[uVar9 + uVar10];
                      uVar9 = uVar9 + 1;
                      puVar8 = puVar8 + 3;
                    } while (uVar12 != uVar9);
                  }
                  params.clip_box.yMax = uVar10;
                  memcpy(puVar5 + uVar13 * __n,__src,__n);
                  uVar13 = uVar13 + 1;
                  uVar10 = params.clip_box.yMax + __n;
                  local_60 = local_60 + __n;
                  lVar11 = lVar11 + __n;
                } while (uVar13 != uVar6);
              }
              ft_mem_free(memory,__src);
              goto LAB_00221a96;
            }
          }
          else {
            local_48 = local_48 + -0x15;
          }
        }
      }
      else {
        local_34[0] = (*render->raster_render)(render->raster,(FT_Raster_Params *)local_f0);
LAB_00221a96:
        if (local_34[0] == 0) {
LAB_00221aa6:
          slot->format = FT_GLYPH_FORMAT_BITMAP;
          goto LAB_00221a01;
        }
      }
    }
  }
  else {
    local_34[0] = 6;
LAB_002219bd:
    local_48 = 0;
    yOffset = 0;
  }
  if ((slot->internal->flags & 1) != 0) {
    ft_mem_free(memory,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
  }
LAB_00221a01:
  if (local_48 != 0 || yOffset != 0) {
    FT_Outline_Translate(outline,-local_48,-yOffset);
  }
  return local_34[0];
}

Assistant:

static FT_Error
  ft_smooth_render_generic( FT_Renderer       render,
                            FT_GlyphSlot      slot,
                            FT_Render_Mode    mode,
                            const FT_Vector*  origin,
                            FT_Render_Mode    required_mode )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;
    FT_Int       hmul    = ( mode == FT_RENDER_MODE_LCD );
    FT_Int       vmul    = ( mode == FT_RENDER_MODE_LCD_V );

    FT_Raster_Params  params;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check mode */
    if ( mode != required_mode )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    ft_glyphslot_preset_bitmap( slot, mode, origin );

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = 64 * -slot->bitmap_left;
    y_shift = 64 * -slot->bitmap_top;
    if ( bitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      y_shift += 64 * (FT_Int)bitmap->rows / 3;
    else
      y_shift += 64 * (FT_Int)bitmap->rows;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    /* set up parameters */
    params.target = bitmap;
    params.source = outline;
    params.flags  = FT_RASTER_FLAG_AA;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING

    /* implode outline if needed */
    {
      FT_Vector*  points     = outline->points;
      FT_Vector*  points_end = points + outline->n_points;
      FT_Vector*  vec;


      if ( hmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->x *= 3;

      if ( vmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->y *= 3;
    }

    /* render outline into the bitmap */
    error = render->raster_render( render->raster, &params );

    /* deflate outline if needed */
    {
      FT_Vector*  points     = outline->points;
      FT_Vector*  points_end = points + outline->n_points;
      FT_Vector*  vec;


      if ( hmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->x /= 3;

      if ( vmul )
        for ( vec = points; vec < points_end; vec++ )
          vec->y /= 3;
    }

    if ( error )
      goto Exit;

    /* finally apply filtering */
    if ( hmul || vmul )
    {
      FT_Byte*                 lcd_weights;
      FT_Bitmap_LcdFilterFunc  lcd_filter_func;


      /* Per-face LCD filtering takes priority if set up. */
      if ( slot->face && slot->face->internal->lcd_filter_func )
      {
        lcd_weights     = slot->face->internal->lcd_weights;
        lcd_filter_func = slot->face->internal->lcd_filter_func;
      }
      else
      {
        lcd_weights     = slot->library->lcd_weights;
        lcd_filter_func = slot->library->lcd_filter_func;
      }

      if ( lcd_filter_func )
        lcd_filter_func( bitmap, mode, lcd_weights );
    }

#else /* !FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

    if ( hmul )  /* lcd */
    {
      FT_Byte*  line;
      FT_Byte*  temp = NULL;
      FT_UInt   i, j;

      unsigned int  height = bitmap->rows;
      unsigned int  width  = bitmap->width;
      int           pitch  = bitmap->pitch;


      /* Render 3 separate monochrome bitmaps, shifting the outline  */
      /* by 1/3 pixel.                                               */
      width /= 3;

      bitmap->buffer += width;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline, -21, 0 );
      x_shift        -= 21;
      bitmap->buffer += width;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline,  42, 0 );
      x_shift        += 42;
      bitmap->buffer -= 2 * width;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      /* XXX: Rearrange the bytes according to FT_PIXEL_MODE_LCD.    */
      /* XXX: It is more efficient to render every third byte above. */

      if ( FT_ALLOC( temp, (FT_ULong)pitch ) )
        goto Exit;

      for ( i = 0; i < height; i++ )
      {
        line = bitmap->buffer + i * (FT_ULong)pitch;
        for ( j = 0; j < width; j++ )
        {
          temp[3 * j    ] = line[j];
          temp[3 * j + 1] = line[j + width];
          temp[3 * j + 2] = line[j + width + width];
        }
        FT_MEM_COPY( line, temp, pitch );
      }

      FT_FREE( temp );
    }
    else if ( vmul )  /* lcd_v */
    {
      int  pitch  = bitmap->pitch;


      /* Render 3 separate monochrome bitmaps, shifting the outline  */
      /* by 1/3 pixel. Triple the pitch to render on each third row. */
      bitmap->pitch *= 3;
      bitmap->rows  /= 3;

      bitmap->buffer += pitch;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline, 0,  21 );
      y_shift        += 21;
      bitmap->buffer += pitch;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      FT_Outline_Translate( outline, 0, -42 );
      y_shift        -= 42;
      bitmap->buffer -= 2 * pitch;

      error = render->raster_render( render->raster, &params );
      if ( error )
        goto Exit;

      bitmap->pitch /= 3;
      bitmap->rows  *= 3;
    }
    else  /* grayscale */
      error = render->raster_render( render->raster, &params );

#endif /* !FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

  Exit:
    if ( !error )
    {
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    }
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }